

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

MemoryRegion_conflict * memory_region_get_flatview_root(MemoryRegion_conflict *mr)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  MemoryRegion *pMVar5;
  MemoryRegion *pMVar6;
  int iVar7;
  char cVar8;
  bool bVar9;
  
  do {
    if (((MemoryRegion *)mr)->enabled != true) goto LAB_00cf85d9;
    if (((MemoryRegion *)mr)->terminates != false) {
      return (MemoryRegion_conflict *)(MemoryRegion *)mr;
    }
    pMVar6 = (((MemoryRegion *)mr)->subregions).tqh_first;
    if (pMVar6 == (MemoryRegion *)0x0) {
      bVar9 = true;
      pMVar5 = (MemoryRegion *)0x0;
    }
    else {
      iVar7 = 0;
      pMVar5 = (MemoryRegion *)0x0;
      do {
        if (pMVar6->enabled == true) {
          if (iVar7 != 0) {
            iVar7 = 2;
            pMVar5 = (MemoryRegion *)0x0;
            break;
          }
          iVar7 = 1;
          if ((pMVar6->addr == 0) &&
             (lVar2 = *(long *)((long)&((MemoryRegion *)mr)->size + 8),
             plVar1 = (long *)((long)&pMVar6->size + 8),
             uVar3 = (ulong)((ulong)((MemoryRegion *)mr)->size < (ulong)pMVar6->size),
             lVar4 = lVar2 - *plVar1,
             (SBORROW8(lVar2,*plVar1) != SBORROW8(lVar4,uVar3)) == (long)(lVar4 - uVar3) < 0)) {
            pMVar5 = pMVar6;
          }
        }
        pMVar6 = (pMVar6->subregions_link).tqe_next;
      } while (pMVar6 != (MemoryRegion *)0x0);
      bVar9 = iVar7 == 0;
    }
    pMVar6 = pMVar5;
    if (pMVar5 == (MemoryRegion *)0x0) {
      pMVar6 = (MemoryRegion *)mr;
    }
    cVar8 = (pMVar5 != (MemoryRegion *)0x0) * '\x02';
    if (bVar9) {
      cVar8 = '\x01';
      pMVar6 = (MemoryRegion *)mr;
    }
    mr = (MemoryRegion_conflict *)pMVar6;
  } while (cVar8 == '\x02');
  if (cVar8 == '\x01') {
LAB_00cf85d9:
    mr = (MemoryRegion_conflict *)0x0;
  }
  return mr;
}

Assistant:

static MemoryRegion *memory_region_get_flatview_root(MemoryRegion *mr)
{
    while (mr->enabled) {
        if (!mr->terminates) {
            unsigned int found = 0;
            MemoryRegion *child, *next = NULL;
            QTAILQ_FOREACH(child, &mr->subregions, subregions_link) {
                if (child->enabled) {
                    if (++found > 1) {
                        next = NULL;
                        break;
                    }
                    if (!child->addr && int128_ge(mr->size, child->size)) {
                        /* A child is included in its entirety.  If it's the only
                         * enabled one, use it in the hope of finding an alias down the
                         * way. This will also let us share FlatViews.
                         */
                        next = child;
                    }
                }
            }
            if (found == 0) {
                return NULL;
            }
            if (next) {
                mr = next;
                continue;
            }
        }

        return mr;
    }

    return NULL;
}